

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct64x64_low16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int *piVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [12];
  uint *puVar50;
  int *piVar51;
  int iVar52;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  int iVar56;
  int iVar57;
  ulong uVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  ulong uVar62;
  int iVar63;
  uint uVar64;
  uint uVar67;
  uint uVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  uint uVar91;
  uint uVar99;
  uint uVar100;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  int iVar101;
  uint uVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined8 local_5e8;
  undefined8 local_5d8;
  undefined1 local_5c8 [16];
  __m128i cospim32;
  undefined8 local_598;
  undefined1 local_568 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  __m128i rnding;
  __m128i cospim48;
  __m128i cospim16;
  __m128i cospi48;
  __m128i cospi32;
  __m128i cospi16;
  uint local_438 [7];
  int iStack_41c;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  int local_3e8;
  int iStack_3e4;
  int iStack_3e0;
  int iStack_3dc;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  uint local_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint local_3a8;
  uint uStack_3a4;
  uint uStack_3a0;
  uint uStack_39c;
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint local_348;
  uint uStack_344;
  uint uStack_340;
  uint uStack_33c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  uint local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int local_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  uint local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  auVar65 = ZEXT416((uint)bit);
  rnding[0]._0_4_ = 1 << ((char)bit - 1U & 0x1f);
  lVar54 = (long)bit * 0x100;
  iVar59 = bd + (uint)(do_cols == 0) * 2;
  iVar60 = 0x8000;
  if (0xf < iVar59 + 6) {
    iVar60 = 1 << ((char)iVar59 + 5U & 0x1f);
  }
  clamp_lo[0]._0_4_ = -iVar60;
  clamp_hi[0]._0_4_ = iVar60 + -1;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x164);
  auVar110._4_4_ = uVar2;
  auVar110._0_4_ = uVar2;
  auVar110._8_4_ = uVar2;
  auVar110._12_4_ = uVar2;
  local_5c8._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x16c);
  local_5c8._0_4_ = local_5c8._4_4_;
  local_5c8._8_4_ = local_5c8._4_4_;
  local_5c8._12_4_ = local_5c8._4_4_;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x174);
  auVar104._4_4_ = uVar2;
  auVar104._0_4_ = uVar2;
  auVar104._8_4_ = uVar2;
  auVar104._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x17c);
  auVar118._4_4_ = uVar2;
  auVar118._0_4_ = uVar2;
  auVar118._8_4_ = uVar2;
  auVar118._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x184);
  auVar131._4_4_ = uVar2;
  auVar131._0_4_ = uVar2;
  auVar131._8_4_ = uVar2;
  auVar131._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x18c);
  auVar103._4_4_ = uVar2;
  auVar103._0_4_ = uVar2;
  auVar103._8_4_ = uVar2;
  auVar103._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x19c);
  auVar125._4_4_ = uVar2;
  auVar125._0_4_ = uVar2;
  auVar125._8_4_ = uVar2;
  auVar125._12_4_ = uVar2;
  cospi16[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x1a0);
  cospi32[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x1e0);
  cospi48[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x220);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x23c);
  auVar134._4_4_ = uVar2;
  auVar134._0_4_ = uVar2;
  auVar134._8_4_ = uVar2;
  auVar134._12_4_ = uVar2;
  cospim16[0]._0_4_ = -(int)cospi16[0];
  cospim32[0]._0_4_ = -(int)cospi32[0];
  cospim48[0]._0_4_ = -(int)cospi48[0];
  auVar49 = *(undefined1 (*) [12])*in;
  puVar50 = &local_1c8;
  local_438[0] = (uint)(*in)[0];
  local_438[1] = (uint)((ulong)(*in)[0] >> 0x20);
  local_438[2] = (uint)(*in)[1];
  local_438[3] = (uint)((ulong)(*in)[1] >> 0x20);
  iStack_16c = (int)((ulong)in[0xd][1] >> 0x20);
  iStack_12c = (int)((ulong)in[3][1] >> 0x20);
  iStack_32c = (int)((ulong)in[2][1] >> 0x20);
  iStack_2ec = (int)((ulong)in[10][1] >> 0x20);
  iStack_2ac = (int)((ulong)in[6][1] >> 0x20);
  iStack_26c = (int)((ulong)in[0xe][1] >> 0x20);
  iStack_3ec = (int)((ulong)in[8][1] >> 0x20);
  uStack_3ac = (uint)((ulong)in[4][1] >> 0x20);
  uStack_36c = (uint)((ulong)in[0xc][1] >> 0x20);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x25c);
  auVar114._4_4_ = uVar2;
  auVar114._0_4_ = uVar2;
  auVar114._8_4_ = uVar2;
  auVar114._12_4_ = uVar2;
  iVar60 = -*(int *)((long)vert_filter_length_chroma + lVar54 + 0x224);
  auVar111 = pmulld(auVar110,(undefined1  [16])in[1]);
  auVar115 = pmulld(auVar114,(undefined1  [16])in[1]);
  auVar88._4_4_ = iVar60;
  auVar88._0_4_ = iVar60;
  auVar88._8_4_ = iVar60;
  auVar88._12_4_ = iVar60;
  auVar89 = pmulld(auVar88,(undefined1  [16])in[0xf]);
  auVar126 = pmulld(auVar125,(undefined1  [16])in[0xf]);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x24c);
  auVar81._4_4_ = uVar2;
  auVar81._0_4_ = uVar2;
  auVar81._8_4_ = uVar2;
  auVar81._12_4_ = uVar2;
  iVar60 = -*(int *)((long)vert_filter_length_chroma + lVar54 + 0x234);
  iVar59 = -*(int *)((long)vert_filter_length_chroma + lVar54 + 0x244);
  auVar132 = pmulld(auVar131,(undefined1  [16])in[9]);
  auVar135 = pmulld(auVar134,(undefined1  [16])in[9]);
  auVar76._4_4_ = iVar59;
  auVar76._0_4_ = iVar59;
  auVar76._8_4_ = iVar59;
  auVar76._12_4_ = iVar59;
  auVar77 = pmulld(auVar76,(undefined1  [16])in[7]);
  auVar119 = pmulld(auVar118,(undefined1  [16])in[7]);
  auVar92._4_4_ = iVar60;
  auVar92._0_4_ = iVar60;
  auVar92._8_4_ = iVar60;
  auVar92._12_4_ = iVar60;
  iVar60 = -*(int *)((long)vert_filter_length_chroma + lVar54 + 0x254);
  auVar105 = pmulld(auVar104,(undefined1  [16])in[5]);
  auVar82 = pmulld(auVar81,(undefined1  [16])in[5]);
  auVar86._4_4_ = iVar60;
  auVar86._0_4_ = iVar60;
  auVar86._8_4_ = iVar60;
  auVar86._12_4_ = iVar60;
  auVar93 = pmulld(auVar92,(undefined1  [16])in[0xb]);
  auVar74 = pmulld(auVar103,(undefined1  [16])in[0xb]);
  local_618._0_4_ = auVar111._0_4_ + (int)rnding[0] >> auVar65;
  local_618._4_4_ = auVar111._4_4_ + (int)rnding[0] >> auVar65;
  local_618._8_4_ = auVar111._8_4_ + (int)rnding[0] >> auVar65;
  local_618._12_4_ = auVar111._12_4_ + (int)rnding[0] >> auVar65;
  local_48 = local_618._0_4_;
  iStack_44 = local_618._4_4_;
  iStack_40 = local_618._8_4_;
  iStack_3c = local_618._12_4_;
  local_628._0_4_ = auVar115._0_4_ + (int)rnding[0] >> auVar65;
  local_628._4_4_ = auVar115._4_4_ + (int)rnding[0] >> auVar65;
  local_628._8_4_ = auVar115._8_4_ + (int)rnding[0] >> auVar65;
  local_628._12_4_ = auVar115._12_4_ + (int)rnding[0] >> auVar65;
  local_238 = local_628._0_4_;
  iStack_234 = local_628._4_4_;
  iStack_230 = local_628._8_4_;
  iStack_22c = local_628._12_4_;
  local_208 = auVar89._0_4_ + (int)rnding[0] >> auVar65;
  iStack_204 = auVar89._4_4_ + (int)rnding[0] >> auVar65;
  iStack_200 = auVar89._8_4_ + (int)rnding[0] >> auVar65;
  iStack_1fc = auVar89._12_4_ + (int)rnding[0] >> auVar65;
  local_568._0_4_ = auVar126._0_4_ + (int)rnding[0] >> auVar65;
  local_568._4_4_ = auVar126._4_4_ + (int)rnding[0] >> auVar65;
  local_568._8_4_ = auVar126._8_4_ + (int)rnding[0] >> auVar65;
  local_568._12_4_ = auVar126._12_4_ + (int)rnding[0] >> auVar65;
  local_78 = local_568._0_4_;
  iStack_74 = local_568._4_4_;
  iStack_70 = local_568._8_4_;
  iStack_6c = local_568._12_4_;
  local_538._0_4_ = auVar132._0_4_ + (int)rnding[0] >> auVar65;
  local_538._4_4_ = auVar132._4_4_ + (int)rnding[0] >> auVar65;
  local_538._8_4_ = auVar132._8_4_ + (int)rnding[0] >> auVar65;
  local_538._12_4_ = auVar132._12_4_ + (int)rnding[0] >> auVar65;
  local_88 = local_538._0_4_;
  iStack_84 = local_538._4_4_;
  iStack_80 = local_538._8_4_;
  iStack_7c = local_538._12_4_;
  local_548._0_4_ = auVar135._0_4_ + (int)rnding[0] >> auVar65;
  local_548._4_4_ = auVar135._4_4_ + (int)rnding[0] >> auVar65;
  local_548._8_4_ = auVar135._8_4_ + (int)rnding[0] >> auVar65;
  local_548._12_4_ = auVar135._12_4_ + (int)rnding[0] >> auVar65;
  local_1f8 = local_548._0_4_;
  iStack_1f4 = local_548._4_4_;
  iStack_1f0 = local_548._8_4_;
  iStack_1ec = local_548._12_4_;
  local_518._0_4_ = auVar77._0_4_ + (int)rnding[0] >> auVar65;
  local_518._4_4_ = auVar77._4_4_ + (int)rnding[0] >> auVar65;
  local_518._8_4_ = auVar77._8_4_ + (int)rnding[0] >> auVar65;
  local_518._12_4_ = auVar77._12_4_ + (int)rnding[0] >> auVar65;
  local_1c8 = local_518._0_4_;
  iStack_1c4 = local_518._4_4_;
  iStack_1c0 = local_518._8_4_;
  iStack_1bc = local_518._12_4_;
  local_528._0_4_ = auVar119._0_4_ + (int)rnding[0] >> auVar65;
  local_528._4_4_ = auVar119._4_4_ + (int)rnding[0] >> auVar65;
  local_528._8_4_ = auVar119._8_4_ + (int)rnding[0] >> auVar65;
  local_528._12_4_ = auVar119._12_4_ + (int)rnding[0] >> auVar65;
  local_b8 = local_528._0_4_;
  iStack_b4 = local_528._4_4_;
  iStack_b0 = local_528._8_4_;
  iStack_ac = local_528._12_4_;
  local_608._0_4_ = auVar105._0_4_ + (int)rnding[0] >> auVar65;
  local_608._4_4_ = auVar105._4_4_ + (int)rnding[0] >> auVar65;
  local_608._8_4_ = auVar105._8_4_ + (int)rnding[0] >> auVar65;
  local_608._12_4_ = auVar105._12_4_ + (int)rnding[0] >> auVar65;
  local_c8 = local_608._0_4_;
  iStack_c4 = local_608._4_4_;
  iStack_c0 = local_608._8_4_;
  iStack_bc = local_608._12_4_;
  local_1b8 = auVar82._0_4_ + (int)rnding[0] >> auVar65;
  iStack_1b4 = auVar82._4_4_ + (int)rnding[0] >> auVar65;
  iStack_1b0 = auVar82._8_4_ + (int)rnding[0] >> auVar65;
  iStack_1ac = auVar82._12_4_ + (int)rnding[0] >> auVar65;
  local_5d8 = CONCAT44(iStack_1b4,local_1b8);
  local_188 = auVar93._0_4_ + (int)rnding[0] >> auVar65;
  iStack_184 = auVar93._4_4_ + (int)rnding[0] >> auVar65;
  iStack_180 = auVar93._8_4_ + (int)rnding[0] >> auVar65;
  iStack_17c = auVar93._12_4_ + (int)rnding[0] >> auVar65;
  local_f8 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_f4 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_f0 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_ec = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  local_5e8 = CONCAT44(iStack_f4,local_f8);
  auVar37._12_4_ = iStack_12c;
  auVar37._0_12_ = *(undefined1 (*) [12])in[3];
  auVar77 = pmulld(auVar86,auVar37);
  auVar74 = pmulld(local_5c8,auVar37);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x194);
  auVar66._4_4_ = uVar2;
  auVar66._0_4_ = uVar2;
  auVar66._8_4_ = uVar2;
  auVar66._12_4_ = uVar2;
  local_148 = auVar77._0_4_ + (int)rnding[0] >> auVar65;
  iStack_144 = auVar77._4_4_ + (int)rnding[0] >> auVar65;
  iStack_140 = auVar77._8_4_ + (int)rnding[0] >> auVar65;
  iStack_13c = auVar77._12_4_ + (int)rnding[0] >> auVar65;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x22c);
  auVar127._4_4_ = uVar2;
  auVar127._0_4_ = uVar2;
  auVar127._8_4_ = uVar2;
  auVar127._12_4_ = uVar2;
  local_138 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_134 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_130 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_12c = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  auVar32._12_4_ = iStack_16c;
  auVar32._0_12_ = *(undefined1 (*) [12])in[0xd];
  auVar74 = pmulld(auVar66,auVar32);
  auVar77 = pmulld(auVar127,auVar32);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x168);
  auVar70._4_4_ = uVar2;
  auVar70._0_4_ = uVar2;
  auVar70._8_4_ = uVar2;
  auVar70._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 600);
  auVar83._4_4_ = uVar2;
  auVar83._0_4_ = uVar2;
  auVar83._8_4_ = uVar2;
  auVar83._12_4_ = uVar2;
  local_108 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_104 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_100 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_fc = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  local_178 = auVar77._0_4_ + (int)rnding[0] >> auVar65;
  iStack_174 = auVar77._4_4_ + (int)rnding[0] >> auVar65;
  iStack_170 = auVar77._8_4_ + (int)rnding[0] >> auVar65;
  iStack_16c = auVar77._12_4_ + (int)rnding[0] >> auVar65;
  auVar93._12_4_ = iStack_32c;
  auVar93._0_12_ = *(undefined1 (*) [12])in[2];
  auVar74 = pmulld(auVar70,auVar93);
  auVar77 = pmulld(auVar83,auVar93);
  iVar60 = -*(int *)((long)vert_filter_length_chroma + lVar54 + 0x228);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x198);
  auVar75._4_4_ = uVar2;
  auVar75._0_4_ = uVar2;
  auVar75._8_4_ = uVar2;
  auVar75._12_4_ = uVar2;
  auVar120._4_4_ = iVar60;
  auVar120._0_4_ = iVar60;
  auVar120._8_4_ = iVar60;
  auVar120._12_4_ = iVar60;
  local_248 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_244 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_240 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_23c = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  local_598 = CONCAT44(iStack_244,local_248);
  local_338 = auVar77._0_4_ + (int)rnding[0] >> auVar65;
  iStack_334 = auVar77._4_4_ + (int)rnding[0] >> auVar65;
  iStack_330 = auVar77._8_4_ + (int)rnding[0] >> auVar65;
  iStack_32c = auVar77._12_4_ + (int)rnding[0] >> auVar65;
  auVar109._12_4_ = iStack_26c;
  auVar109._0_12_ = *(undefined1 (*) [12])in[0xe];
  auVar77 = pmulld(auVar120,auVar109);
  auVar74 = pmulld(auVar75,auVar109);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x188);
  auVar112._4_4_ = uVar2;
  auVar112._0_4_ = uVar2;
  auVar112._8_4_ = uVar2;
  auVar112._12_4_ = uVar2;
  local_308 = auVar77._0_4_ + (int)rnding[0] >> auVar65;
  iStack_304 = auVar77._4_4_ + (int)rnding[0] >> auVar65;
  iStack_300 = auVar77._8_4_ + (int)rnding[0] >> auVar65;
  iStack_2fc = auVar77._12_4_ + (int)rnding[0] >> auVar65;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x238);
  auVar106._4_4_ = uVar2;
  auVar106._0_4_ = uVar2;
  auVar106._8_4_ = uVar2;
  auVar106._12_4_ = uVar2;
  local_278 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_274 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_270 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_26c = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  auVar115._12_4_ = iStack_2ec;
  auVar115._0_12_ = *(undefined1 (*) [12])in[10];
  auVar77 = pmulld(auVar112,auVar115);
  auVar74 = pmulld(auVar106,auVar115);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar54 + 0x178);
  auVar90._4_4_ = uVar2;
  auVar90._0_4_ = uVar2;
  auVar90._8_4_ = uVar2;
  auVar90._12_4_ = uVar2;
  iVar60 = -*(int *)((long)vert_filter_length_chroma + lVar54 + 0x248);
  auVar133._4_4_ = iVar60;
  auVar133._0_4_ = iVar60;
  auVar133._8_4_ = iVar60;
  auVar133._12_4_ = iVar60;
  local_288 = auVar77._0_4_ + (int)rnding[0] >> auVar65;
  iStack_284 = auVar77._4_4_ + (int)rnding[0] >> auVar65;
  iStack_280 = auVar77._8_4_ + (int)rnding[0] >> auVar65;
  iStack_27c = auVar77._12_4_ + (int)rnding[0] >> auVar65;
  local_2f8 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_2f4 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_2f0 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_2ec = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  auVar132._12_4_ = iStack_2ac;
  auVar132._0_12_ = *(undefined1 (*) [12])in[6];
  auVar77 = pmulld(auVar133,auVar132);
  auVar74 = pmulld(auVar90,auVar132);
  local_2c8 = auVar77._0_4_ + (int)rnding[0] >> auVar65;
  iStack_2c4 = auVar77._4_4_ + (int)rnding[0] >> auVar65;
  iStack_2c0 = auVar77._8_4_ + (int)rnding[0] >> auVar65;
  iStack_2bc = auVar77._12_4_ + (int)rnding[0] >> auVar65;
  local_2b8 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_2b4 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_2b0 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_2ac = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  iVar60 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x170);
  auVar136._4_4_ = iVar60;
  auVar136._0_4_ = iVar60;
  auVar136._8_4_ = iVar60;
  auVar136._12_4_ = iVar60;
  iVar59 = *(int *)((long)vert_filter_length_chroma + lVar54 + 400);
  auVar128._4_4_ = iVar59;
  auVar128._0_4_ = iVar59;
  auVar128._8_4_ = iVar59;
  auVar128._12_4_ = iVar59;
  iVar52 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x230);
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x250);
  auVar78._4_4_ = iVar56;
  auVar78._0_4_ = iVar56;
  auVar78._8_4_ = iVar56;
  auVar78._12_4_ = iVar56;
  iVar63 = -iVar52;
  auVar71._4_4_ = iVar63;
  auVar71._0_4_ = iVar63;
  auVar71._8_4_ = iVar63;
  auVar71._12_4_ = iVar63;
  auVar82._12_4_ = uStack_3ac;
  auVar82._0_12_ = *(undefined1 (*) [12])in[4];
  auVar74 = pmulld(auVar82,auVar136);
  local_348 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  uStack_344 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  uStack_340 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  uStack_33c = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  auVar74 = pmulld(auVar82,auVar78);
  local_3b8 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  uStack_3b4 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  uStack_3b0 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  uStack_3ac = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  auVar89._12_4_ = uStack_36c;
  auVar89._0_12_ = *(undefined1 (*) [12])in[0xc];
  auVar74 = pmulld(auVar89,auVar71);
  local_388 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  uStack_384 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  uStack_380 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  uStack_37c = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  auVar74 = pmulld(auVar89,auVar128);
  local_378 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  uStack_374 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  uStack_370 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  uStack_36c = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  iVar60 = -iVar60;
  auVar129._4_4_ = iVar60;
  auVar129._0_4_ = iVar60;
  auVar129._8_4_ = iVar60;
  auVar129._12_4_ = iVar60;
  auVar89 = pmulld(local_628,auVar129);
  auVar93 = pmulld(local_618,auVar78);
  iVar56 = -iVar56;
  auVar87._4_4_ = iVar56;
  auVar87._0_4_ = iVar56;
  auVar87._8_4_ = iVar56;
  auVar87._12_4_ = iVar56;
  auVar74._4_4_ = iStack_204;
  auVar74._0_4_ = local_208;
  auVar74._8_4_ = iStack_200;
  auVar74._12_4_ = iStack_1fc;
  auVar111 = pmulld(auVar87,auVar74);
  auVar105 = pmulld(local_568,auVar129);
  iVar60 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x1d0);
  auVar94._4_4_ = iVar60;
  auVar94._0_4_ = iVar60;
  auVar94._8_4_ = iVar60;
  auVar94._12_4_ = iVar60;
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x1f0);
  iVar63 = -iVar56;
  auVar72._4_4_ = iVar63;
  auVar72._0_4_ = iVar63;
  auVar72._8_4_ = iVar63;
  auVar72._12_4_ = iVar63;
  auVar115 = pmulld(local_548,auVar72);
  auVar119 = pmulld(local_538,auVar94);
  iVar60 = -iVar60;
  auVar121._4_4_ = iVar60;
  auVar121._0_4_ = iVar60;
  auVar121._8_4_ = iVar60;
  auVar121._12_4_ = iVar60;
  auVar122 = pmulld(auVar121,local_518);
  auVar126 = pmulld(local_528,auVar72);
  auVar77 = pmulld(local_518,auVar72);
  auVar135 = pmulld(local_528,auVar94);
  auVar82 = pmulld(local_548,auVar94);
  auVar95._4_4_ = iVar56;
  auVar95._0_4_ = iVar56;
  auVar95._8_4_ = iVar56;
  auVar95._12_4_ = iVar56;
  auVar132 = pmulld(local_538,auVar95);
  local_a8 = auVar135._0_4_ + (int)rnding[0] + auVar77._0_4_ >> auVar65;
  iStack_a4 = auVar135._4_4_ + (int)rnding[0] + auVar77._4_4_ >> auVar65;
  iStack_a0 = auVar135._8_4_ + (int)rnding[0] + auVar77._8_4_ >> auVar65;
  iStack_9c = auVar135._12_4_ + (int)rnding[0] + auVar77._12_4_ >> auVar65;
  local_98 = auVar82._0_4_ + (int)rnding[0] + auVar132._0_4_ >> auVar65;
  iStack_94 = auVar82._4_4_ + (int)rnding[0] + auVar132._4_4_ >> auVar65;
  iStack_90 = auVar82._8_4_ + (int)rnding[0] + auVar132._8_4_ >> auVar65;
  iStack_8c = auVar82._12_4_ + (int)rnding[0] + auVar132._12_4_ >> auVar65;
  auVar74 = pmulld(auVar74,auVar129);
  auVar77 = pmulld(local_568,auVar78);
  local_68 = auVar77._0_4_ + (int)rnding[0] + auVar74._0_4_ >> auVar65;
  iStack_64 = auVar77._4_4_ + (int)rnding[0] + auVar74._4_4_ >> auVar65;
  iStack_60 = auVar77._8_4_ + (int)rnding[0] + auVar74._8_4_ >> auVar65;
  iStack_5c = auVar77._12_4_ + (int)rnding[0] + auVar74._12_4_ >> auVar65;
  auVar77 = pmulld(local_628,auVar78);
  auVar74 = pmulld(local_618,auVar136);
  iVar60 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x1b0);
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x210);
  local_58 = auVar77._0_4_ + (int)rnding[0] + auVar74._0_4_ >> auVar65;
  iStack_54 = auVar77._4_4_ + (int)rnding[0] + auVar74._4_4_ >> auVar65;
  iStack_50 = auVar77._8_4_ + (int)rnding[0] + auVar74._8_4_ >> auVar65;
  iStack_4c = auVar77._12_4_ + (int)rnding[0] + auVar74._12_4_ >> auVar65;
  auVar73._4_4_ = iVar56;
  auVar73._0_4_ = iVar56;
  auVar73._8_4_ = iVar56;
  auVar73._12_4_ = iVar56;
  iVar63 = -iVar60;
  local_228 = auVar89._0_4_ + (int)rnding[0] + auVar93._0_4_ >> auVar65;
  iStack_224 = auVar89._4_4_ + (int)rnding[0] + auVar93._4_4_ >> auVar65;
  iStack_220 = auVar89._8_4_ + (int)rnding[0] + auVar93._8_4_ >> auVar65;
  iStack_21c = auVar89._12_4_ + (int)rnding[0] + auVar93._12_4_ >> auVar65;
  auVar96._4_4_ = iVar63;
  auVar96._0_4_ = iVar63;
  auVar96._8_4_ = iVar63;
  auVar96._12_4_ = iVar63;
  iVar56 = -iVar56;
  local_218 = auVar105._0_4_ + (int)rnding[0] + auVar111._0_4_ >> auVar65;
  iStack_214 = auVar105._4_4_ + (int)rnding[0] + auVar111._4_4_ >> auVar65;
  iStack_210 = auVar105._8_4_ + (int)rnding[0] + auVar111._8_4_ >> auVar65;
  iStack_20c = auVar105._12_4_ + (int)rnding[0] + auVar111._12_4_ >> auVar65;
  local_1e8 = auVar115._0_4_ + (int)rnding[0] + auVar119._0_4_ >> auVar65;
  iStack_1e4 = auVar115._4_4_ + (int)rnding[0] + auVar119._4_4_ >> auVar65;
  iStack_1e0 = auVar115._8_4_ + (int)rnding[0] + auVar119._8_4_ >> auVar65;
  iStack_1dc = auVar115._12_4_ + (int)rnding[0] + auVar119._12_4_ >> auVar65;
  local_1d8 = auVar126._0_4_ + (int)rnding[0] + auVar122._0_4_ >> auVar65;
  iStack_1d4 = auVar126._4_4_ + (int)rnding[0] + auVar122._4_4_ >> auVar65;
  iStack_1d0 = auVar126._8_4_ + (int)rnding[0] + auVar122._8_4_ >> auVar65;
  iStack_1cc = auVar126._12_4_ + (int)rnding[0] + auVar122._12_4_ >> auVar65;
  auVar117._8_4_ = iStack_1b0;
  auVar117._0_8_ = local_5d8;
  auVar117._12_4_ = iStack_1ac;
  auVar82 = pmulld(auVar117,auVar96);
  auVar89 = pmulld(local_608,auVar73);
  auVar84._4_4_ = iVar56;
  auVar84._0_4_ = iVar56;
  auVar84._8_4_ = iVar56;
  auVar84._12_4_ = iVar56;
  auVar130._4_4_ = iStack_184;
  auVar130._0_4_ = local_188;
  auVar130._8_4_ = iStack_180;
  auVar130._12_4_ = iStack_17c;
  auVar93 = pmulld(auVar84,auVar130);
  auVar43._8_4_ = iStack_f0;
  auVar43._0_8_ = local_5e8;
  auVar43._12_4_ = iStack_ec;
  auVar105 = pmulld(auVar43,auVar96);
  auVar123._4_4_ = iVar52;
  auVar123._0_4_ = iVar52;
  auVar123._8_4_ = iVar52;
  auVar123._12_4_ = iVar52;
  auVar34._4_4_ = iStack_174;
  auVar34._0_4_ = local_178;
  auVar34._8_4_ = iStack_170;
  auVar34._12_4_ = iStack_16c;
  auVar119 = pmulld(auVar34,auVar71);
  auVar39._4_4_ = iStack_104;
  auVar39._0_4_ = local_108;
  auVar39._8_4_ = iStack_100;
  auVar39._12_4_ = iStack_fc;
  auVar115 = pmulld(auVar123,auVar39);
  auVar111 = pmulld(auVar39,auVar128);
  iVar59 = -iVar59;
  auVar116._4_4_ = iVar59;
  auVar116._0_4_ = iVar59;
  auVar116._8_4_ = iVar59;
  auVar116._12_4_ = iVar59;
  auVar36._4_4_ = iStack_144;
  auVar36._0_4_ = local_148;
  auVar36._8_4_ = iStack_140;
  auVar36._12_4_ = iStack_13c;
  auVar126 = pmulld(auVar116,auVar36);
  auVar38._4_4_ = iStack_134;
  auVar38._0_4_ = local_138;
  auVar38._8_4_ = iStack_130;
  auVar38._12_4_ = iStack_12c;
  auVar74 = pmulld(auVar38,auVar71);
  auVar132 = pmulld(auVar36,auVar71);
  auVar135 = pmulld(auVar38,auVar128);
  auVar77 = pmulld(auVar34,auVar128);
  local_128 = auVar135._0_4_ + (int)rnding[0] + auVar132._0_4_ >> auVar65;
  iStack_124 = auVar135._4_4_ + (int)rnding[0] + auVar132._4_4_ >> auVar65;
  iStack_120 = auVar135._8_4_ + (int)rnding[0] + auVar132._8_4_ >> auVar65;
  iStack_11c = auVar135._12_4_ + (int)rnding[0] + auVar132._12_4_ >> auVar65;
  local_118 = auVar77._0_4_ + (int)rnding[0] + auVar115._0_4_ >> auVar65;
  iStack_114 = auVar77._4_4_ + (int)rnding[0] + auVar115._4_4_ >> auVar65;
  iStack_110 = auVar77._8_4_ + (int)rnding[0] + auVar115._8_4_ >> auVar65;
  iStack_10c = auVar77._12_4_ + (int)rnding[0] + auVar115._12_4_ >> auVar65;
  auVar77 = pmulld(auVar130,auVar96);
  iVar59 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x180);
  iVar52 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x1c0);
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x200);
  iVar63 = *(int *)((long)vert_filter_length_chroma + lVar54 + 0x240);
  auVar115 = pmulld(auVar43,auVar73);
  iVar57 = -iVar59;
  local_e8 = auVar115._0_4_ + (int)rnding[0] + auVar77._0_4_ >> auVar65;
  iStack_e4 = auVar115._4_4_ + (int)rnding[0] + auVar77._4_4_ >> auVar65;
  iStack_e0 = auVar115._8_4_ + (int)rnding[0] + auVar77._8_4_ >> auVar65;
  iStack_dc = auVar115._12_4_ + (int)rnding[0] + auVar77._12_4_ >> auVar65;
  auVar97._4_4_ = iVar60;
  auVar97._0_4_ = iVar60;
  auVar97._8_4_ = iVar60;
  auVar97._12_4_ = iVar60;
  auVar77 = pmulld(auVar117,auVar73);
  iVar61 = -iVar56;
  auVar115 = pmulld(local_608,auVar97);
  iVar60 = -iVar63;
  local_d8 = auVar77._0_4_ + (int)rnding[0] + auVar115._0_4_ >> auVar65;
  iStack_d4 = auVar77._4_4_ + (int)rnding[0] + auVar115._4_4_ >> auVar65;
  iStack_d0 = auVar77._8_4_ + (int)rnding[0] + auVar115._8_4_ >> auVar65;
  iStack_cc = auVar77._12_4_ + (int)rnding[0] + auVar115._12_4_ >> auVar65;
  auVar113._4_4_ = iVar59;
  auVar113._0_4_ = iVar59;
  auVar113._8_4_ = iVar59;
  auVar113._12_4_ = iVar59;
  local_1a8 = auVar82._0_4_ + (int)rnding[0] + auVar89._0_4_ >> auVar65;
  iStack_1a4 = auVar82._4_4_ + (int)rnding[0] + auVar89._4_4_ >> auVar65;
  iStack_1a0 = auVar82._8_4_ + (int)rnding[0] + auVar89._8_4_ >> auVar65;
  iStack_19c = auVar82._12_4_ + (int)rnding[0] + auVar89._12_4_ >> auVar65;
  auVar137._4_4_ = iVar52;
  auVar137._0_4_ = iVar52;
  auVar137._8_4_ = iVar52;
  auVar137._12_4_ = iVar52;
  auVar107._4_4_ = iVar63;
  auVar107._0_4_ = iVar63;
  auVar107._8_4_ = iVar63;
  auVar107._12_4_ = iVar63;
  auVar124._4_4_ = iVar57;
  auVar124._0_4_ = iVar57;
  auVar124._8_4_ = iVar57;
  auVar124._12_4_ = iVar57;
  auVar79._4_4_ = iVar61;
  auVar79._0_4_ = iVar61;
  auVar79._8_4_ = iVar61;
  auVar79._12_4_ = iVar61;
  auVar98._4_4_ = iVar60;
  auVar98._0_4_ = iVar60;
  auVar98._8_4_ = iVar60;
  auVar98._12_4_ = iVar60;
  local_198 = auVar93._0_4_ + (int)rnding[0] + auVar105._0_4_ >> auVar65;
  iStack_194 = auVar93._4_4_ + (int)rnding[0] + auVar105._4_4_ >> auVar65;
  iStack_190 = auVar93._8_4_ + (int)rnding[0] + auVar105._8_4_ >> auVar65;
  iStack_18c = auVar93._12_4_ + (int)rnding[0] + auVar105._12_4_ >> auVar65;
  local_168 = auVar111._0_4_ + (int)rnding[0] + auVar119._0_4_ >> auVar65;
  iStack_164 = auVar111._4_4_ + (int)rnding[0] + auVar119._4_4_ >> auVar65;
  iStack_160 = auVar111._8_4_ + (int)rnding[0] + auVar119._8_4_ >> auVar65;
  iStack_15c = auVar111._12_4_ + (int)rnding[0] + auVar119._12_4_ >> auVar65;
  local_158 = auVar126._0_4_ + (int)rnding[0] + auVar74._0_4_ >> auVar65;
  iStack_154 = auVar126._4_4_ + (int)rnding[0] + auVar74._4_4_ >> auVar65;
  iStack_150 = auVar126._8_4_ + (int)rnding[0] + auVar74._8_4_ >> auVar65;
  iStack_14c = auVar126._12_4_ + (int)rnding[0] + auVar74._12_4_ >> auVar65;
  auVar77._12_4_ = iStack_3ec;
  auVar77._0_12_ = *(undefined1 (*) [12])in[8];
  auVar74 = pmulld(auVar77,auVar113);
  local_3c8 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_3c4 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_3c0 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_3bc = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  auVar74 = pmulld(auVar77,auVar107);
  local_3f8 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_3f4 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_3f0 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_3ec = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  local_3a8 = local_3b8;
  uStack_3a4 = uStack_3b4;
  uStack_3a0 = uStack_3b0;
  uStack_39c = uStack_3ac;
  local_398 = local_388;
  uStack_394 = uStack_384;
  uStack_390 = uStack_380;
  uStack_38c = uStack_37c;
  local_368 = local_378;
  uStack_364 = uStack_374;
  uStack_360 = uStack_370;
  uStack_35c = uStack_36c;
  local_358 = local_348;
  uStack_354 = uStack_344;
  uStack_350 = uStack_340;
  uStack_34c = uStack_33c;
  auVar105._4_4_ = iStack_334;
  auVar105._0_4_ = local_338;
  auVar105._8_4_ = iStack_330;
  auVar105._12_4_ = iStack_32c;
  auVar111._4_4_ = iStack_304;
  auVar111._0_4_ = local_308;
  auVar111._8_4_ = iStack_300;
  auVar111._12_4_ = iStack_2fc;
  auVar74 = pmulld(auVar105,auVar124);
  auVar25._8_4_ = iStack_240;
  auVar25._0_8_ = local_598;
  auVar25._12_4_ = iStack_23c;
  auVar93 = pmulld(auVar25,auVar107);
  auVar117 = pmulld(auVar111,auVar98);
  auVar23._4_4_ = iStack_274;
  auVar23._0_4_ = local_278;
  auVar23._8_4_ = iStack_270;
  auVar23._12_4_ = iStack_26c;
  auVar82 = pmulld(auVar23,auVar124);
  auVar119._4_4_ = iStack_2f4;
  auVar119._0_4_ = local_2f8;
  auVar119._8_4_ = iStack_2f0;
  auVar119._12_4_ = iStack_2ec;
  auVar115 = pmulld(auVar119,auVar79);
  auVar122._4_4_ = iStack_284;
  auVar122._0_4_ = local_288;
  auVar122._8_4_ = iStack_280;
  auVar122._12_4_ = iStack_27c;
  auVar130 = pmulld(auVar122,auVar137);
  iVar52 = -iVar52;
  auVar108._4_4_ = iVar52;
  auVar108._0_4_ = iVar52;
  auVar108._8_4_ = iVar52;
  auVar108._12_4_ = iVar52;
  auVar126._4_4_ = iStack_2c4;
  auVar126._0_4_ = local_2c8;
  auVar126._8_4_ = iStack_2c0;
  auVar126._12_4_ = iStack_2bc;
  auVar132 = pmulld(auVar126,auVar108);
  auVar135._4_4_ = iStack_2b4;
  auVar135._0_4_ = local_2b8;
  auVar135._8_4_ = iStack_2b0;
  auVar135._12_4_ = iStack_2ac;
  auVar109 = pmulld(auVar135,auVar79);
  auVar77 = pmulld(auVar126,auVar79);
  auVar89 = pmulld(auVar135,auVar137);
  local_2a8 = auVar89._0_4_ + (int)rnding[0] + auVar77._0_4_ >> auVar65;
  iStack_2a4 = auVar89._4_4_ + (int)rnding[0] + auVar77._4_4_ >> auVar65;
  iStack_2a0 = auVar89._8_4_ + (int)rnding[0] + auVar77._8_4_ >> auVar65;
  iStack_29c = auVar89._12_4_ + (int)rnding[0] + auVar77._12_4_ >> auVar65;
  auVar80._4_4_ = iVar56;
  auVar80._0_4_ = iVar56;
  auVar80._8_4_ = iVar56;
  auVar80._12_4_ = iVar56;
  auVar119 = pmulld(auVar119,auVar137);
  auVar89 = pmulld(auVar122,auVar80);
  auVar111 = pmulld(auVar111,auVar124);
  auVar77 = pmulld(auVar23,auVar107);
  local_298 = auVar119._0_4_ + (int)rnding[0] + auVar89._0_4_ >> auVar65;
  iStack_294 = auVar119._4_4_ + (int)rnding[0] + auVar89._4_4_ >> auVar65;
  iStack_290 = auVar119._8_4_ + (int)rnding[0] + auVar89._8_4_ >> auVar65;
  iStack_28c = auVar119._12_4_ + (int)rnding[0] + auVar89._12_4_ >> auVar65;
  local_268 = auVar77._0_4_ + (int)rnding[0] + auVar111._0_4_ >> auVar65;
  iStack_264 = auVar77._4_4_ + (int)rnding[0] + auVar111._4_4_ >> auVar65;
  iStack_260 = auVar77._8_4_ + (int)rnding[0] + auVar111._8_4_ >> auVar65;
  iStack_25c = auVar77._12_4_ + (int)rnding[0] + auVar111._12_4_ >> auVar65;
  auVar77 = pmulld(auVar105,auVar107);
  auVar89 = pmulld(auVar25,auVar113);
  local_258 = auVar77._0_4_ + (int)rnding[0] + auVar89._0_4_ >> auVar65;
  iStack_254 = auVar77._4_4_ + (int)rnding[0] + auVar89._4_4_ >> auVar65;
  iStack_250 = auVar77._8_4_ + (int)rnding[0] + auVar89._8_4_ >> auVar65;
  iStack_24c = auVar77._12_4_ + (int)rnding[0] + auVar89._12_4_ >> auVar65;
  local_328 = auVar93._0_4_ + (int)rnding[0] + auVar74._0_4_ >> auVar65;
  iStack_324 = auVar93._4_4_ + (int)rnding[0] + auVar74._4_4_ >> auVar65;
  iStack_320 = auVar93._8_4_ + (int)rnding[0] + auVar74._8_4_ >> auVar65;
  iStack_31c = auVar93._12_4_ + (int)rnding[0] + auVar74._12_4_ >> auVar65;
  local_318 = auVar117._0_4_ + (int)rnding[0] + auVar82._0_4_ >> auVar65;
  iStack_314 = auVar117._4_4_ + (int)rnding[0] + auVar82._4_4_ >> auVar65;
  iStack_310 = auVar117._8_4_ + (int)rnding[0] + auVar82._8_4_ >> auVar65;
  iStack_30c = auVar117._12_4_ + (int)rnding[0] + auVar82._12_4_ >> auVar65;
  local_2e8 = auVar130._0_4_ + (int)rnding[0] + auVar115._0_4_ >> auVar65;
  iStack_2e4 = auVar130._4_4_ + (int)rnding[0] + auVar115._4_4_ >> auVar65;
  iStack_2e0 = auVar130._8_4_ + (int)rnding[0] + auVar115._8_4_ >> auVar65;
  iStack_2dc = auVar130._12_4_ + (int)rnding[0] + auVar115._12_4_ >> auVar65;
  local_2d8 = auVar132._0_4_ + (int)rnding[0] + auVar109._0_4_ >> auVar65;
  iStack_2d4 = auVar132._4_4_ + (int)rnding[0] + auVar109._4_4_ >> auVar65;
  iStack_2d0 = auVar132._8_4_ + (int)rnding[0] + auVar109._8_4_ >> auVar65;
  iStack_2cc = auVar132._12_4_ + (int)rnding[0] + auVar109._12_4_ >> auVar65;
  for (uVar53 = 0x20; uVar53 < 0x40; uVar53 = uVar53 + 8) {
    iVar63 = puVar50[-0x10] + puVar50[-0x1c];
    iVar57 = puVar50[-0xf] + puVar50[-0x1b];
    iVar61 = puVar50[-0xe] + puVar50[-0x1a];
    iVar101 = puVar50[-0xd] + puVar50[-0x19];
    iVar60 = puVar50[-0x1c] - puVar50[-0x10];
    iVar59 = puVar50[-0x1b] - puVar50[-0xf];
    iVar52 = puVar50[-0x1a] - puVar50[-0xe];
    iVar56 = puVar50[-0x19] - puVar50[-0xd];
    uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
    uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
    uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
    uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
    uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
    uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
    uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
    uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
    puVar50[-0x1c] =
         (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
    puVar50[-0x1b] =
         (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
    puVar50[-0x1a] =
         (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
    puVar50[-0x19] =
         (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
    puVar50[-0x10] =
         (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
    puVar50[-0xf] =
         (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
    puVar50[-0xe] =
         (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
    puVar50[-0xd] =
         (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
    iVar60 = puVar50[-0x14] + puVar50[-0x18];
    iVar59 = puVar50[-0x13] + puVar50[-0x17];
    iVar52 = puVar50[-0x12] + puVar50[-0x16];
    iVar56 = puVar50[-0x11] + puVar50[-0x15];
    iVar63 = puVar50[-0x18] - puVar50[-0x14];
    iVar57 = puVar50[-0x17] - puVar50[-0x13];
    iVar61 = puVar50[-0x16] - puVar50[-0x12];
    iVar101 = puVar50[-0x15] - puVar50[-0x11];
    uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
    uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
    uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
    uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
    uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
    uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
    uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
    uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
    puVar50[-0x18] =
         (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
    puVar50[-0x17] =
         (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
    puVar50[-0x16] =
         (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
    puVar50[-0x15] =
         (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
    puVar50[-0x14] =
         (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
    puVar50[-0x13] =
         (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
    puVar50[-0x12] =
         (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
    puVar50[-0x11] =
         (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
    iVar63 = puVar50[-0xc] + *puVar50;
    iVar57 = puVar50[-0xb] + puVar50[1];
    iVar61 = puVar50[-10] + puVar50[2];
    iVar101 = puVar50[-9] + puVar50[3];
    iVar60 = *puVar50 - puVar50[-0xc];
    iVar59 = puVar50[1] - puVar50[-0xb];
    iVar52 = puVar50[2] - puVar50[-10];
    iVar56 = puVar50[3] - puVar50[-9];
    uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
    uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
    uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
    uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
    uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
    uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
    uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
    uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
    *puVar50 = (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
    puVar50[1] = (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
                 ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
    puVar50[2] = (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
                 ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
    puVar50[3] = (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
                 ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
    puVar50[-0xc] =
         (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
    puVar50[-0xb] =
         (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
    puVar50[-10] = (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
                   ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
    puVar50[-9] = (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
    iVar63 = puVar50[-8] + puVar50[-4];
    iVar57 = puVar50[-7] + puVar50[-3];
    iVar61 = puVar50[-6] + puVar50[-2];
    iVar101 = puVar50[-5] + puVar50[-1];
    iVar60 = puVar50[-4] - puVar50[-8];
    iVar59 = puVar50[-3] - puVar50[-7];
    iVar52 = puVar50[-2] - puVar50[-6];
    iVar56 = puVar50[-1] - puVar50[-5];
    uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
    uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
    uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
    uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
    uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
    uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
    uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
    uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
    puVar50[-4] = (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
    puVar50[-3] = (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
    puVar50[-2] = (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
    puVar50[-1] = (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
    puVar50[-8] = (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
    puVar50[-7] = (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
    puVar50[-6] = (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
    puVar50[-5] = (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
    puVar50 = puVar50 + 0x20;
  }
  auVar7._4_4_ = (int)cospi32[0];
  auVar7._0_4_ = (int)cospi32[0];
  auVar7._8_4_ = (int)cospi32[0];
  auVar7._12_4_ = (int)cospi32[0];
  puVar50 = &local_2c8;
  auVar9._12_4_ = local_438[3];
  auVar9._0_12_ = auVar49;
  auVar74 = pmulld(auVar9,auVar7);
  local_438[4] = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  local_438[5] = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  local_438[6] = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_41c = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  local_438[0] = local_438[4];
  local_438[1] = local_438[5];
  local_438[2] = local_438[6];
  local_438[3] = iStack_41c;
  auVar12._4_4_ = uStack_3b4;
  auVar12._0_4_ = local_3b8;
  auVar12._8_4_ = uStack_3b0;
  auVar12._12_4_ = uStack_3ac;
  auVar13._4_4_ = uStack_384;
  auVar13._0_4_ = local_388;
  auVar13._8_4_ = uStack_380;
  auVar13._12_4_ = uStack_37c;
  local_3e8 = local_3f8;
  iStack_3e4 = iStack_3f4;
  iStack_3e0 = iStack_3f0;
  iStack_3dc = iStack_3ec;
  local_3d8 = local_3c8;
  iStack_3d4 = iStack_3c4;
  iStack_3d0 = iStack_3c0;
  iStack_3cc = iStack_3bc;
  auVar5._4_4_ = (int)cospim16[0];
  auVar5._0_4_ = (int)cospim16[0];
  auVar5._8_4_ = (int)cospim16[0];
  auVar5._12_4_ = (int)cospim16[0];
  auVar74 = pmulld(auVar12,auVar5);
  auVar6._4_4_ = (int)cospi48[0];
  auVar6._0_4_ = (int)cospi48[0];
  auVar6._8_4_ = (int)cospi48[0];
  auVar6._12_4_ = (int)cospi48[0];
  auVar15._4_4_ = uStack_344;
  auVar15._0_4_ = local_348;
  auVar15._8_4_ = uStack_340;
  auVar15._12_4_ = uStack_33c;
  auVar77 = pmulld(auVar15,auVar6);
  local_3a8 = auVar74._0_4_ + (int)rnding[0] + auVar77._0_4_ >> auVar65;
  uStack_3a4 = auVar74._4_4_ + (int)rnding[0] + auVar77._4_4_ >> auVar65;
  uStack_3a0 = auVar74._8_4_ + (int)rnding[0] + auVar77._8_4_ >> auVar65;
  uStack_39c = auVar74._12_4_ + (int)rnding[0] + auVar77._12_4_ >> auVar65;
  auVar77 = pmulld(auVar12,auVar6);
  auVar8._4_4_ = (int)cospi16[0];
  auVar8._0_4_ = (int)cospi16[0];
  auVar8._8_4_ = (int)cospi16[0];
  auVar8._12_4_ = (int)cospi16[0];
  auVar74 = pmulld(auVar15,auVar8);
  local_358 = auVar77._0_4_ + (int)rnding[0] + auVar74._0_4_ >> auVar65;
  uStack_354 = auVar77._4_4_ + (int)rnding[0] + auVar74._4_4_ >> auVar65;
  uStack_350 = auVar77._8_4_ + (int)rnding[0] + auVar74._8_4_ >> auVar65;
  uStack_34c = auVar77._12_4_ + (int)rnding[0] + auVar74._12_4_ >> auVar65;
  auVar4._4_4_ = (int)cospim48[0];
  auVar4._0_4_ = (int)cospim48[0];
  auVar4._8_4_ = (int)cospim48[0];
  auVar4._12_4_ = (int)cospim48[0];
  auVar74 = pmulld(auVar13,auVar4);
  auVar14._4_4_ = uStack_374;
  auVar14._0_4_ = local_378;
  auVar14._8_4_ = uStack_370;
  auVar14._12_4_ = uStack_36c;
  auVar77 = pmulld(auVar14,auVar5);
  local_398 = auVar74._0_4_ + (int)rnding[0] + auVar77._0_4_ >> auVar65;
  uStack_394 = auVar74._4_4_ + (int)rnding[0] + auVar77._4_4_ >> auVar65;
  uStack_390 = auVar74._8_4_ + (int)rnding[0] + auVar77._8_4_ >> auVar65;
  uStack_38c = auVar74._12_4_ + (int)rnding[0] + auVar77._12_4_ >> auVar65;
  auVar74 = pmulld(auVar13,auVar5);
  auVar77 = pmulld(auVar14,auVar6);
  local_368 = auVar74._0_4_ + (int)rnding[0] + auVar77._0_4_ >> auVar65;
  uStack_364 = auVar74._4_4_ + (int)rnding[0] + auVar77._4_4_ >> auVar65;
  uStack_360 = auVar74._8_4_ + (int)rnding[0] + auVar77._8_4_ >> auVar65;
  uStack_35c = auVar74._12_4_ + (int)rnding[0] + auVar77._12_4_ >> auVar65;
  for (uVar53 = 0x10; uVar53 < 0x20; uVar53 = uVar53 + 8) {
    iVar63 = puVar50[-0x10] + puVar50[-0x1c];
    iVar57 = puVar50[-0xf] + puVar50[-0x1b];
    iVar61 = puVar50[-0xe] + puVar50[-0x1a];
    iVar101 = puVar50[-0xd] + puVar50[-0x19];
    iVar60 = puVar50[-0x1c] - puVar50[-0x10];
    iVar59 = puVar50[-0x1b] - puVar50[-0xf];
    iVar52 = puVar50[-0x1a] - puVar50[-0xe];
    iVar56 = puVar50[-0x19] - puVar50[-0xd];
    uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
    uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
    uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
    uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
    uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
    uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
    uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
    uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
    puVar50[-0x1c] =
         (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
    puVar50[-0x1b] =
         (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
    puVar50[-0x1a] =
         (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
    puVar50[-0x19] =
         (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
    puVar50[-0x10] =
         (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
    puVar50[-0xf] =
         (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
    puVar50[-0xe] =
         (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
    puVar50[-0xd] =
         (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
    iVar60 = puVar50[-0x14] + puVar50[-0x18];
    iVar59 = puVar50[-0x13] + puVar50[-0x17];
    iVar52 = puVar50[-0x12] + puVar50[-0x16];
    iVar56 = puVar50[-0x11] + puVar50[-0x15];
    iVar63 = puVar50[-0x18] - puVar50[-0x14];
    iVar57 = puVar50[-0x17] - puVar50[-0x13];
    iVar61 = puVar50[-0x16] - puVar50[-0x12];
    iVar101 = puVar50[-0x15] - puVar50[-0x11];
    uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
    uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
    uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
    uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
    uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
    uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
    uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
    uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
    puVar50[-0x18] =
         (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
    puVar50[-0x17] =
         (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
    puVar50[-0x16] =
         (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
    puVar50[-0x15] =
         (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
    puVar50[-0x14] =
         (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
    puVar50[-0x13] =
         (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
    puVar50[-0x12] =
         (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
    puVar50[-0x11] =
         (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
    iVar63 = puVar50[-0xc] + *puVar50;
    iVar57 = puVar50[-0xb] + puVar50[1];
    iVar61 = puVar50[-10] + puVar50[2];
    iVar101 = puVar50[-9] + puVar50[3];
    iVar60 = *puVar50 - puVar50[-0xc];
    iVar59 = puVar50[1] - puVar50[-0xb];
    iVar52 = puVar50[2] - puVar50[-10];
    iVar56 = puVar50[3] - puVar50[-9];
    uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
    uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
    uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
    uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
    uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
    uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
    uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
    uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
    *puVar50 = (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
    puVar50[1] = (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
                 ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
    puVar50[2] = (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
                 ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
    puVar50[3] = (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
                 ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
    puVar50[-0xc] =
         (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
    puVar50[-0xb] =
         (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
    puVar50[-10] = (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
                   ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
    puVar50[-9] = (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
    iVar63 = puVar50[-8] + puVar50[-4];
    iVar57 = puVar50[-7] + puVar50[-3];
    iVar61 = puVar50[-6] + puVar50[-2];
    iVar101 = puVar50[-5] + puVar50[-1];
    iVar60 = puVar50[-4] - puVar50[-8];
    iVar59 = puVar50[-3] - puVar50[-7];
    iVar52 = puVar50[-2] - puVar50[-6];
    iVar56 = puVar50[-1] - puVar50[-5];
    uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
    uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
    uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
    uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
    uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
    uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
    uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
    uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
    puVar50[-4] = (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
    puVar50[-3] = (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
    puVar50[-2] = (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
    puVar50[-1] = (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
    puVar50[-8] = (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
    puVar50[-7] = (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
    puVar50[-6] = (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
    puVar50[-5] = (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
                  ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
    puVar50 = puVar50 + 0x20;
  }
  piVar51 = &local_238;
  auVar26._4_4_ = iStack_214;
  auVar26._0_4_ = local_218;
  auVar26._8_4_ = iStack_210;
  auVar26._12_4_ = iStack_20c;
  auVar74 = pmulld(auVar26,auVar124);
  auVar48._4_4_ = iStack_64;
  auVar48._0_4_ = local_68;
  auVar48._8_4_ = iStack_60;
  auVar48._12_4_ = iStack_5c;
  auVar93 = pmulld(auVar48,auVar107);
  auVar27._4_4_ = iStack_204;
  auVar27._0_4_ = local_208;
  auVar27._8_4_ = iStack_200;
  auVar27._12_4_ = iStack_1fc;
  auVar111 = pmulld(auVar27,auVar124);
  auVar47._4_4_ = iStack_74;
  auVar47._0_4_ = local_78;
  auVar47._8_4_ = iStack_70;
  auVar47._12_4_ = iStack_6c;
  auVar77 = pmulld(auVar47,auVar107);
  auVar28._4_4_ = iStack_1f4;
  auVar28._0_4_ = local_1f8;
  auVar28._8_4_ = iStack_1f0;
  auVar28._12_4_ = iStack_1ec;
  auVar115 = pmulld(auVar28,auVar98);
  auVar46._4_4_ = iStack_84;
  auVar46._0_4_ = local_88;
  auVar46._8_4_ = iStack_80;
  auVar46._12_4_ = iStack_7c;
  auVar119 = pmulld(auVar46,auVar124);
  auVar29._4_4_ = iStack_1e4;
  auVar29._0_4_ = local_1e8;
  auVar29._8_4_ = iStack_1e0;
  auVar29._12_4_ = iStack_1dc;
  auVar89 = pmulld(auVar98,auVar29);
  auVar45._4_4_ = iStack_94;
  auVar45._0_4_ = local_98;
  auVar45._8_4_ = iStack_90;
  auVar45._12_4_ = iStack_8c;
  auVar126 = pmulld(auVar45,auVar124);
  auVar105 = pmulld(auVar29,auVar124);
  auVar82 = pmulld(auVar45,auVar107);
  local_98 = auVar105._0_4_ + (int)rnding[0] + auVar82._0_4_ >> auVar65;
  iStack_94 = auVar105._4_4_ + (int)rnding[0] + auVar82._4_4_ >> auVar65;
  iStack_90 = auVar105._8_4_ + (int)rnding[0] + auVar82._8_4_ >> auVar65;
  iStack_8c = auVar105._12_4_ + (int)rnding[0] + auVar82._12_4_ >> auVar65;
  auVar82 = pmulld(auVar28,auVar124);
  auVar105 = pmulld(auVar46,auVar107);
  local_88 = auVar82._0_4_ + (int)rnding[0] + auVar105._0_4_ >> auVar65;
  iStack_84 = auVar82._4_4_ + (int)rnding[0] + auVar105._4_4_ >> auVar65;
  iStack_80 = auVar82._8_4_ + (int)rnding[0] + auVar105._8_4_ >> auVar65;
  iStack_7c = auVar82._12_4_ + (int)rnding[0] + auVar105._12_4_ >> auVar65;
  auVar105 = pmulld(auVar27,auVar107);
  auVar82 = pmulld(auVar47,auVar113);
  local_78 = auVar105._0_4_ + (int)rnding[0] + auVar82._0_4_ >> auVar65;
  iStack_74 = auVar105._4_4_ + (int)rnding[0] + auVar82._4_4_ >> auVar65;
  iStack_70 = auVar105._8_4_ + (int)rnding[0] + auVar82._8_4_ >> auVar65;
  iStack_6c = auVar105._12_4_ + (int)rnding[0] + auVar82._12_4_ >> auVar65;
  auVar82 = pmulld(auVar26,auVar107);
  auVar105 = pmulld(auVar48,auVar113);
  local_68 = auVar105._0_4_ + auVar82._0_4_ + (int)rnding[0] >> auVar65;
  iStack_64 = auVar105._4_4_ + auVar82._4_4_ + (int)rnding[0] >> auVar65;
  iStack_60 = auVar105._8_4_ + auVar82._8_4_ + (int)rnding[0] >> auVar65;
  iStack_5c = auVar105._12_4_ + auVar82._12_4_ + (int)rnding[0] >> auVar65;
  local_218 = auVar93._0_4_ + auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_214 = auVar93._4_4_ + auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_210 = auVar93._8_4_ + auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_20c = auVar93._12_4_ + auVar74._12_4_ + (int)rnding[0] >> auVar65;
  local_208 = auVar111._0_4_ + (int)rnding[0] + auVar77._0_4_ >> auVar65;
  iStack_204 = auVar111._4_4_ + (int)rnding[0] + auVar77._4_4_ >> auVar65;
  iStack_200 = auVar111._8_4_ + (int)rnding[0] + auVar77._8_4_ >> auVar65;
  iStack_1fc = auVar111._12_4_ + (int)rnding[0] + auVar77._12_4_ >> auVar65;
  local_1f8 = auVar115._0_4_ + (int)rnding[0] + auVar119._0_4_ >> auVar65;
  iStack_1f4 = auVar115._4_4_ + (int)rnding[0] + auVar119._4_4_ >> auVar65;
  iStack_1f0 = auVar115._8_4_ + (int)rnding[0] + auVar119._8_4_ >> auVar65;
  iStack_1ec = auVar115._12_4_ + (int)rnding[0] + auVar119._12_4_ >> auVar65;
  local_1e8 = auVar89._0_4_ + (int)rnding[0] + auVar126._0_4_ >> auVar65;
  iStack_1e4 = auVar89._4_4_ + (int)rnding[0] + auVar126._4_4_ >> auVar65;
  iStack_1e0 = auVar89._8_4_ + (int)rnding[0] + auVar126._8_4_ >> auVar65;
  iStack_1dc = auVar89._12_4_ + (int)rnding[0] + auVar126._12_4_ >> auVar65;
  auVar30._4_4_ = iStack_194;
  auVar30._0_4_ = local_198;
  auVar30._8_4_ = iStack_190;
  auVar30._12_4_ = iStack_18c;
  auVar93 = pmulld(auVar30,auVar79);
  auVar44._4_4_ = iStack_e4;
  auVar44._0_4_ = local_e8;
  auVar44._8_4_ = iStack_e0;
  auVar44._12_4_ = iStack_dc;
  auVar74 = pmulld(auVar44,auVar137);
  auVar31._4_4_ = iStack_184;
  auVar31._0_4_ = local_188;
  auVar31._8_4_ = iStack_180;
  auVar31._12_4_ = iStack_17c;
  auVar119 = pmulld(auVar31,auVar79);
  auVar42._4_4_ = iStack_f4;
  auVar42._0_4_ = local_f8;
  auVar42._8_4_ = iStack_f0;
  auVar42._12_4_ = iStack_ec;
  auVar111 = pmulld(auVar42,auVar137);
  auVar33._4_4_ = iStack_174;
  auVar33._0_4_ = local_178;
  auVar33._8_4_ = iStack_170;
  auVar33._12_4_ = iStack_16c;
  auVar135 = pmulld(auVar33,auVar108);
  auVar41._4_4_ = iStack_104;
  auVar41._0_4_ = local_108;
  auVar41._8_4_ = iStack_100;
  auVar41._12_4_ = iStack_fc;
  auVar115 = pmulld(auVar41,auVar79);
  auVar35._4_4_ = iStack_164;
  auVar35._0_4_ = local_168;
  auVar35._8_4_ = iStack_160;
  auVar35._12_4_ = iStack_15c;
  auVar77 = pmulld(auVar108,auVar35);
  auVar40._4_4_ = iStack_114;
  auVar40._0_4_ = local_118;
  auVar40._8_4_ = iStack_110;
  auVar40._12_4_ = iStack_10c;
  auVar126 = pmulld(auVar40,auVar79);
  auVar82 = pmulld(auVar35,auVar79);
  auVar89 = pmulld(auVar40,auVar137);
  local_118 = auVar82._0_4_ + (int)rnding[0] + auVar89._0_4_ >> auVar65;
  iStack_114 = auVar82._4_4_ + (int)rnding[0] + auVar89._4_4_ >> auVar65;
  iStack_110 = auVar82._8_4_ + (int)rnding[0] + auVar89._8_4_ >> auVar65;
  iStack_10c = auVar82._12_4_ + (int)rnding[0] + auVar89._12_4_ >> auVar65;
  auVar82 = pmulld(auVar33,auVar79);
  auVar89 = pmulld(auVar41,auVar137);
  local_108 = auVar82._0_4_ + (int)rnding[0] + auVar89._0_4_ >> auVar65;
  iStack_104 = auVar82._4_4_ + (int)rnding[0] + auVar89._4_4_ >> auVar65;
  iStack_100 = auVar82._8_4_ + (int)rnding[0] + auVar89._8_4_ >> auVar65;
  iStack_fc = auVar82._12_4_ + (int)rnding[0] + auVar89._12_4_ >> auVar65;
  auVar132 = pmulld(auVar31,auVar137);
  auVar82 = pmulld(auVar42,auVar80);
  auVar105 = pmulld(auVar30,auVar137);
  auVar89 = pmulld(auVar44,auVar80);
  local_f8 = auVar132._0_4_ + (int)rnding[0] + auVar82._0_4_ >> auVar65;
  iStack_f4 = auVar132._4_4_ + (int)rnding[0] + auVar82._4_4_ >> auVar65;
  iStack_f0 = auVar132._8_4_ + (int)rnding[0] + auVar82._8_4_ >> auVar65;
  iStack_ec = auVar132._12_4_ + (int)rnding[0] + auVar82._12_4_ >> auVar65;
  local_e8 = auVar105._0_4_ + (int)rnding[0] + auVar89._0_4_ >> auVar65;
  iStack_e4 = auVar105._4_4_ + (int)rnding[0] + auVar89._4_4_ >> auVar65;
  iStack_e0 = auVar105._8_4_ + (int)rnding[0] + auVar89._8_4_ >> auVar65;
  iStack_dc = auVar105._12_4_ + (int)rnding[0] + auVar89._12_4_ >> auVar65;
  local_198 = auVar93._0_4_ + (int)rnding[0] + auVar74._0_4_ >> auVar65;
  iStack_194 = auVar93._4_4_ + (int)rnding[0] + auVar74._4_4_ >> auVar65;
  iStack_190 = auVar93._8_4_ + (int)rnding[0] + auVar74._8_4_ >> auVar65;
  iStack_18c = auVar93._12_4_ + (int)rnding[0] + auVar74._12_4_ >> auVar65;
  local_188 = auVar119._0_4_ + (int)rnding[0] + auVar111._0_4_ >> auVar65;
  iStack_184 = auVar119._4_4_ + (int)rnding[0] + auVar111._4_4_ >> auVar65;
  iStack_180 = auVar119._8_4_ + (int)rnding[0] + auVar111._8_4_ >> auVar65;
  iStack_17c = auVar119._12_4_ + (int)rnding[0] + auVar111._12_4_ >> auVar65;
  local_178 = auVar135._0_4_ + (int)rnding[0] + auVar115._0_4_ >> auVar65;
  iStack_174 = auVar135._4_4_ + (int)rnding[0] + auVar115._4_4_ >> auVar65;
  iStack_170 = auVar135._8_4_ + (int)rnding[0] + auVar115._8_4_ >> auVar65;
  iStack_16c = auVar135._12_4_ + (int)rnding[0] + auVar115._12_4_ >> auVar65;
  local_168 = auVar77._0_4_ + (int)rnding[0] + auVar126._0_4_ >> auVar65;
  iStack_164 = auVar77._4_4_ + (int)rnding[0] + auVar126._4_4_ >> auVar65;
  iStack_160 = auVar77._8_4_ + (int)rnding[0] + auVar126._8_4_ >> auVar65;
  iStack_15c = auVar77._12_4_ + (int)rnding[0] + auVar126._12_4_ >> auVar65;
  local_408 = CONCAT44(local_438[5],local_438[4]);
  uStack_400 = CONCAT44(iStack_41c,local_438[6]);
  auVar10._4_4_ = iStack_3f4;
  auVar10._0_4_ = local_3f8;
  auVar10._8_4_ = iStack_3f0;
  auVar10._12_4_ = iStack_3ec;
  auVar11._4_4_ = iStack_3c4;
  auVar11._0_4_ = local_3c8;
  auVar11._8_4_ = iStack_3c0;
  auVar11._12_4_ = iStack_3bc;
  auVar3._4_4_ = (int)cospim32[0];
  auVar3._0_4_ = (int)cospim32[0];
  auVar3._8_4_ = (int)cospim32[0];
  auVar3._12_4_ = (int)cospim32[0];
  auVar77 = pmulld(auVar3,auVar10);
  auVar82 = pmulld(auVar11,auVar7);
  auVar85._0_4_ = local_3c8 + local_3f8;
  auVar85._4_4_ = iStack_3c4 + iStack_3f4;
  auVar85._8_4_ = iStack_3c0 + iStack_3f0;
  auVar85._12_4_ = iStack_3bc + iStack_3ec;
  auVar74 = pmulld(auVar85,auVar7);
  local_418 = CONCAT44(local_438[5],local_438[4]);
  uStack_410 = CONCAT44(iStack_41c,local_438[6]);
  local_3d8 = auVar74._0_4_ + (int)rnding[0] >> auVar65;
  iStack_3d4 = auVar74._4_4_ + (int)rnding[0] >> auVar65;
  iStack_3d0 = auVar74._8_4_ + (int)rnding[0] >> auVar65;
  iStack_3cc = auVar74._12_4_ + (int)rnding[0] >> auVar65;
  local_3e8 = auVar77._0_4_ + (int)rnding[0] + auVar82._0_4_ >> auVar65;
  iStack_3e4 = auVar77._4_4_ + (int)rnding[0] + auVar82._4_4_ >> auVar65;
  iStack_3e0 = auVar77._8_4_ + (int)rnding[0] + auVar82._8_4_ >> auVar65;
  iStack_3dc = auVar77._12_4_ + (int)rnding[0] + auVar82._12_4_ >> auVar65;
  iVar63 = local_388 + local_3b8;
  iVar57 = uStack_384 + uStack_3b4;
  iVar61 = uStack_380 + uStack_3b0;
  iVar101 = uStack_37c + uStack_3ac;
  iVar60 = local_3b8 - local_388;
  iVar59 = uStack_3b4 - uStack_384;
  iVar52 = uStack_3b0 - uStack_380;
  iVar56 = uStack_3ac - uStack_37c;
  uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
  uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
  uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
            (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
  uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
            (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
  uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
  uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
  uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
  uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
  local_3b8 = (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
              ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
  uStack_3b4 = (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
  uStack_3b0 = (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
  uStack_3ac = (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
  local_388 = (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
              ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
  uStack_384 = (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
  uStack_380 = (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
  uStack_37c = (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
  iVar63 = local_398 + local_3a8;
  iVar57 = uStack_394 + uStack_3a4;
  iVar61 = uStack_390 + uStack_3a0;
  iVar101 = uStack_38c + uStack_39c;
  iVar60 = local_3a8 - local_398;
  iVar59 = uStack_3a4 - uStack_394;
  iVar52 = uStack_3a0 - uStack_390;
  iVar56 = uStack_39c - uStack_38c;
  uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
  uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
  uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
            (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
  uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
            (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
  uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
  uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
  uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
  uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
  local_3a8 = (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
              ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
  uStack_3a4 = (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
  uStack_3a0 = (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
  uStack_39c = (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
  local_398 = (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
              ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
  uStack_394 = (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
  uStack_390 = (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
  uStack_38c = (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
  iVar63 = local_378 + local_348;
  iVar57 = uStack_374 + uStack_344;
  iVar61 = uStack_370 + uStack_340;
  iVar101 = uStack_36c + uStack_33c;
  iVar60 = local_348 - local_378;
  iVar59 = uStack_344 - uStack_374;
  iVar52 = uStack_340 - uStack_370;
  iVar56 = uStack_33c - uStack_36c;
  uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
  uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
  uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
            (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
  uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
            (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
  uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
  uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
  uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
  uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
  local_348 = (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
              ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
  uStack_344 = (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
  uStack_340 = (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
  uStack_33c = (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
  local_378 = (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
              ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
  uStack_374 = (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
  uStack_370 = (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
  uStack_36c = (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
  iVar63 = local_368 + local_358;
  iVar57 = uStack_364 + uStack_354;
  iVar61 = uStack_360 + uStack_350;
  iVar101 = uStack_35c + uStack_34c;
  iVar60 = local_358 - local_368;
  iVar59 = uStack_354 - uStack_364;
  iVar52 = uStack_350 - uStack_360;
  iVar56 = uStack_34c - uStack_35c;
  uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
  uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
  uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
            (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
  uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
            (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
  uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
  uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
  uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
  uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
           (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
  local_358 = (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
              ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
  uStack_354 = (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
  uStack_350 = (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
  uStack_34c = (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
  local_368 = (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
              ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
  uStack_364 = (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
  uStack_360 = (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
  uStack_35c = (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
  auVar16._4_4_ = iStack_314;
  auVar16._0_4_ = local_318;
  auVar16._8_4_ = iStack_310;
  auVar16._12_4_ = iStack_30c;
  auVar17._4_4_ = iStack_304;
  auVar17._0_4_ = local_308;
  auVar17._8_4_ = iStack_300;
  auVar17._12_4_ = iStack_2fc;
  auVar18._4_4_ = iStack_2f4;
  auVar18._0_4_ = local_2f8;
  auVar18._8_4_ = iStack_2f0;
  auVar18._12_4_ = iStack_2ec;
  auVar115 = pmulld(auVar16,auVar5);
  auVar24._4_4_ = iStack_264;
  auVar24._0_4_ = local_268;
  auVar24._8_4_ = iStack_260;
  auVar24._12_4_ = iStack_25c;
  auVar77 = pmulld(auVar24,auVar6);
  auVar111 = pmulld(auVar17,auVar5);
  auVar22._4_4_ = iStack_274;
  auVar22._0_4_ = local_278;
  auVar22._8_4_ = iStack_270;
  auVar22._12_4_ = iStack_26c;
  auVar82 = pmulld(auVar22,auVar6);
  auVar119 = pmulld(auVar18,auVar4);
  auVar21._4_4_ = iStack_284;
  auVar21._0_4_ = local_288;
  auVar21._8_4_ = iStack_280;
  auVar21._12_4_ = iStack_27c;
  auVar93 = pmulld(auVar21,auVar5);
  auVar19._4_4_ = iStack_2e4;
  auVar19._0_4_ = local_2e8;
  auVar19._8_4_ = iStack_2e0;
  auVar19._12_4_ = iStack_2dc;
  auVar74 = pmulld(auVar4,auVar19);
  auVar89 = pmulld(auVar19,auVar5);
  auVar20._4_4_ = iStack_294;
  auVar20._0_4_ = local_298;
  auVar20._8_4_ = iStack_290;
  auVar20._12_4_ = iStack_28c;
  auVar105 = pmulld(auVar20,auVar6);
  auVar126 = pmulld(auVar20,auVar5);
  local_298 = auVar89._0_4_ + (int)rnding[0] + auVar105._0_4_ >> auVar65;
  iStack_294 = auVar89._4_4_ + (int)rnding[0] + auVar105._4_4_ >> auVar65;
  iStack_290 = auVar89._8_4_ + (int)rnding[0] + auVar105._8_4_ >> auVar65;
  iStack_28c = auVar89._12_4_ + (int)rnding[0] + auVar105._12_4_ >> auVar65;
  auVar105 = pmulld(auVar18,auVar5);
  auVar89 = pmulld(auVar21,auVar6);
  local_288 = auVar105._0_4_ + (int)rnding[0] + auVar89._0_4_ >> auVar65;
  iStack_284 = auVar105._4_4_ + (int)rnding[0] + auVar89._4_4_ >> auVar65;
  iStack_280 = auVar105._8_4_ + (int)rnding[0] + auVar89._8_4_ >> auVar65;
  iStack_27c = auVar105._12_4_ + (int)rnding[0] + auVar89._12_4_ >> auVar65;
  auVar105 = pmulld(auVar17,auVar6);
  auVar89 = pmulld(auVar22,auVar8);
  local_278 = auVar105._0_4_ + (int)rnding[0] + auVar89._0_4_ >> auVar65;
  iStack_274 = auVar105._4_4_ + (int)rnding[0] + auVar89._4_4_ >> auVar65;
  iStack_270 = auVar105._8_4_ + (int)rnding[0] + auVar89._8_4_ >> auVar65;
  iStack_26c = auVar105._12_4_ + (int)rnding[0] + auVar89._12_4_ >> auVar65;
  auVar105 = pmulld(auVar16,auVar6);
  auVar89 = pmulld(auVar24,auVar8);
  local_268 = auVar105._0_4_ + (int)rnding[0] + auVar89._0_4_ >> auVar65;
  iStack_264 = auVar105._4_4_ + (int)rnding[0] + auVar89._4_4_ >> auVar65;
  iStack_260 = auVar105._8_4_ + (int)rnding[0] + auVar89._8_4_ >> auVar65;
  iStack_25c = auVar105._12_4_ + (int)rnding[0] + auVar89._12_4_ >> auVar65;
  local_318 = auVar115._0_4_ + (int)rnding[0] + auVar77._0_4_ >> auVar65;
  iStack_314 = auVar115._4_4_ + (int)rnding[0] + auVar77._4_4_ >> auVar65;
  iStack_310 = auVar115._8_4_ + (int)rnding[0] + auVar77._8_4_ >> auVar65;
  iStack_30c = auVar115._12_4_ + (int)rnding[0] + auVar77._12_4_ >> auVar65;
  local_308 = auVar111._0_4_ + (int)rnding[0] + auVar82._0_4_ >> auVar65;
  iStack_304 = auVar111._4_4_ + (int)rnding[0] + auVar82._4_4_ >> auVar65;
  iStack_300 = auVar111._8_4_ + (int)rnding[0] + auVar82._8_4_ >> auVar65;
  iStack_2fc = auVar111._12_4_ + (int)rnding[0] + auVar82._12_4_ >> auVar65;
  local_2f8 = auVar119._0_4_ + (int)rnding[0] + auVar93._0_4_ >> auVar65;
  iStack_2f4 = auVar119._4_4_ + (int)rnding[0] + auVar93._4_4_ >> auVar65;
  iStack_2f0 = auVar119._8_4_ + (int)rnding[0] + auVar93._8_4_ >> auVar65;
  iStack_2ec = auVar119._12_4_ + (int)rnding[0] + auVar93._12_4_ >> auVar65;
  local_2e8 = auVar74._0_4_ + (int)rnding[0] + auVar126._0_4_ >> auVar65;
  iStack_2e4 = auVar74._4_4_ + (int)rnding[0] + auVar126._4_4_ >> auVar65;
  iStack_2e0 = auVar74._8_4_ + (int)rnding[0] + auVar126._8_4_ >> auVar65;
  iStack_2dc = auVar74._12_4_ + (int)rnding[0] + auVar126._12_4_ >> auVar65;
  for (uVar53 = 0x20; (uVar53 & 0xffffffc0) == 0; uVar53 = uVar53 + 0x10) {
    uVar55 = uVar53;
    for (lVar54 = 0; lVar54 != 0x40; lVar54 = lVar54 + 0x10) {
      piVar1 = (int *)((long)piVar51 + lVar54);
      uVar58 = uVar55 ^ 7;
      iVar63 = local_438[uVar58 * 4] + *piVar1;
      iVar57 = local_438[uVar58 * 4 + 1] + piVar1[1];
      iVar61 = local_438[uVar58 * 4 + 2] + piVar1[2];
      iVar101 = local_438[uVar58 * 4 + 3] + piVar1[3];
      iVar60 = *piVar1 - local_438[uVar58 * 4];
      iVar59 = piVar1[1] - local_438[uVar58 * 4 + 1];
      iVar52 = piVar1[2] - local_438[uVar58 * 4 + 2];
      iVar56 = piVar1[3] - local_438[uVar58 * 4 + 3];
      uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
      uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
      uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
                (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
      uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
                (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
      uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
      uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
      uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
      uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
      puVar50 = (uint *)((long)piVar51 + lVar54);
      *puVar50 = (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
                 ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
      puVar50[1] = (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
                   ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
      puVar50[2] = (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
                   ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
      puVar50[3] = (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
                   ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
      local_438[uVar58 * 4] =
           (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
      local_438[uVar58 * 4 + 1] =
           (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
      local_438[uVar58 * 4 + 2] =
           (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
      local_438[uVar58 * 4 + 3] =
           (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
      uVar58 = uVar55 ^ 0xf;
      uVar62 = uVar55 ^ 8;
      iVar63 = local_438[uVar62 * 4] + local_438[uVar58 * 4];
      iVar57 = local_438[uVar62 * 4 + 1] + local_438[uVar58 * 4 + 1];
      iVar61 = local_438[uVar62 * 4 + 2] + local_438[uVar58 * 4 + 2];
      iVar101 = local_438[uVar62 * 4 + 3] + local_438[uVar58 * 4 + 3];
      iVar60 = local_438[uVar58 * 4] - local_438[uVar62 * 4];
      iVar59 = local_438[uVar58 * 4 + 1] - local_438[uVar62 * 4 + 1];
      iVar52 = local_438[uVar58 * 4 + 2] - local_438[uVar62 * 4 + 2];
      iVar56 = local_438[uVar58 * 4 + 3] - local_438[uVar62 * 4 + 3];
      uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
      uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
      uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
                (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
      uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
                (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
      uVar64 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
      uVar67 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
      uVar68 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
      uVar69 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
               (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
      local_438[uVar58 * 4] =
           (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
      local_438[uVar58 * 4 + 1] =
           (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
      local_438[uVar58 * 4 + 2] =
           (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
      local_438[uVar58 * 4 + 3] =
           (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
      local_438[uVar62 * 4] =
           (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
      local_438[uVar62 * 4 + 1] =
           (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
      local_438[uVar62 * 4 + 2] =
           (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
      local_438[uVar62 * 4 + 3] =
           (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
           ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
      uVar55 = uVar55 + 1;
    }
    piVar51 = piVar51 + 0x40;
  }
  puVar50 = local_438;
  for (lVar54 = 0x70; lVar54 != 0x30; lVar54 = lVar54 + -0x10) {
    iVar60 = *(int *)((long)local_438 + lVar54 + 4);
    iVar59 = *(int *)((long)local_438 + lVar54 + 8);
    iVar52 = *(int *)((long)local_438 + lVar54 + 0xc);
    iVar63 = *(int *)((long)local_438 + lVar54) + *puVar50;
    iVar57 = iVar60 + puVar50[1];
    iVar61 = iVar59 + puVar50[2];
    iVar101 = iVar52 + puVar50[3];
    iVar56 = *puVar50 - *(int *)((long)local_438 + lVar54);
    iVar60 = puVar50[1] - iVar60;
    iVar59 = puVar50[2] - iVar59;
    iVar52 = puVar50[3] - iVar52;
    uVar91 = (uint)(iVar63 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar63 >= (int)clamp_lo[0]) * iVar63;
    uVar99 = (uint)(iVar57 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar57 >= (int)clamp_lo[0]) * iVar57;
    uVar100 = (uint)(iVar61 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar61 >= (int)clamp_lo[0]) * iVar61;
    uVar102 = (uint)(iVar101 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
              (uint)(iVar101 >= (int)clamp_lo[0]) * iVar101;
    uVar64 = (uint)(iVar56 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar56 >= (int)clamp_lo[0]) * iVar56;
    uVar67 = (uint)(iVar60 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar60 >= (int)clamp_lo[0]) * iVar60;
    uVar68 = (uint)(iVar59 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar59 >= (int)clamp_lo[0]) * iVar59;
    uVar69 = (uint)(iVar52 < (int)clamp_lo[0]) * (int)clamp_lo[0] |
             (uint)(iVar52 >= (int)clamp_lo[0]) * iVar52;
    *puVar50 = (uint)((int)clamp_hi[0] < (int)uVar91) * (int)clamp_hi[0] |
               ((int)clamp_hi[0] >= (int)uVar91) * uVar91;
    puVar50[1] = (uint)((int)clamp_hi[0] < (int)uVar99) * (int)clamp_hi[0] |
                 ((int)clamp_hi[0] >= (int)uVar99) * uVar99;
    puVar50[2] = (uint)((int)clamp_hi[0] < (int)uVar100) * (int)clamp_hi[0] |
                 ((int)clamp_hi[0] >= (int)uVar100) * uVar100;
    puVar50[3] = (uint)((int)clamp_hi[0] < (int)uVar102) * (int)clamp_hi[0] |
                 ((int)clamp_hi[0] >= (int)uVar102) * uVar102;
    *(uint *)((long)local_438 + lVar54) =
         (uint)((int)clamp_hi[0] < (int)uVar64) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar64) * uVar64;
    *(uint *)((long)local_438 + lVar54 + 4) =
         (uint)((int)clamp_hi[0] < (int)uVar67) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar67) * uVar67;
    *(uint *)((long)local_438 + lVar54 + 8) =
         (uint)((int)clamp_hi[0] < (int)uVar68) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar68) * uVar68;
    *(uint *)((long)local_438 + lVar54 + 0xc) =
         (uint)((int)clamp_hi[0] < (int)uVar69) * (int)clamp_hi[0] |
         ((int)clamp_hi[0] >= (int)uVar69) * uVar69;
    puVar50 = puVar50 + 4;
  }
  cospim32[0]._4_4_ = (int)cospim32[0];
  cospim32[1]._0_4_ = (int)cospim32[0];
  cospim32[1]._4_4_ = (int)cospim32[0];
  clamp_hi[0]._4_4_ = (int)clamp_hi[0];
  clamp_hi[1]._0_4_ = (int)clamp_hi[0];
  clamp_hi[1]._4_4_ = (int)clamp_hi[0];
  clamp_lo[0]._4_4_ = (int)clamp_lo[0];
  clamp_lo[1]._0_4_ = (int)clamp_lo[0];
  clamp_lo[1]._4_4_ = (int)clamp_lo[0];
  rnding[0]._4_4_ = (int)rnding[0];
  rnding[1]._0_4_ = (int)rnding[0];
  rnding[1]._4_4_ = (int)rnding[0];
  cospim48[0]._4_4_ = (int)cospim48[0];
  cospim48[1]._0_4_ = (int)cospim48[0];
  cospim48[1]._4_4_ = (int)cospim48[0];
  cospim16[0]._4_4_ = (int)cospim16[0];
  cospim16[1]._0_4_ = (int)cospim16[0];
  cospim16[1]._4_4_ = (int)cospim16[0];
  cospi48[0]._4_4_ = (int)cospi48[0];
  cospi48[1]._0_4_ = (int)cospi48[0];
  cospi48[1]._4_4_ = (int)cospi48[0];
  cospi32[0]._4_4_ = (int)cospi32[0];
  cospi32[1]._0_4_ = (int)cospi32[0];
  cospi32[1]._4_4_ = (int)cospi32[0];
  cospi16[0]._4_4_ = (int)cospi16[0];
  cospi16[1]._0_4_ = (int)cospi16[0];
  cospi16[1]._4_4_ = (int)cospi16[0];
  idct64_stage8_sse4_1
            ((__m128i *)local_438,&cospim32,&cospi32,&cospim16,&cospi48,&cospi16,&cospim48,&clamp_lo
             ,&clamp_hi,&rnding,bit);
  idct64_stage9_sse4_1((__m128i *)local_438,&cospim32,&cospi32,&clamp_lo,&clamp_hi,&rnding,bit);
  idct64_stage10_sse4_1((__m128i *)local_438,&cospim32,&cospi32,&clamp_lo,&clamp_hi,&rnding,bit);
  idct64_stage11_sse4_1((__m128i *)local_438,out,do_cols,bd,out_shift,&clamp_lo,&clamp_hi);
  return;
}

Assistant:

static void idct64x64_low16_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

  const __m128i cospi1 = _mm_set1_epi32(cospi[1]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi3 = _mm_set1_epi32(cospi[3]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi5 = _mm_set1_epi32(cospi[5]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi7 = _mm_set1_epi32(cospi[7]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi9 = _mm_set1_epi32(cospi[9]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi11 = _mm_set1_epi32(cospi[11]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi13 = _mm_set1_epi32(cospi[13]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi15 = _mm_set1_epi32(cospi[15]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi51 = _mm_set1_epi32(cospi[51]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi55 = _mm_set1_epi32(cospi[55]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi59 = _mm_set1_epi32(cospi[59]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi63 = _mm_set1_epi32(cospi[63]);

  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim12 = _mm_set1_epi32(-cospi[12]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim28 = _mm_set1_epi32(-cospi[28]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim44 = _mm_set1_epi32(-cospi[44]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim49 = _mm_set1_epi32(-cospi[49]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim53 = _mm_set1_epi32(-cospi[53]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim57 = _mm_set1_epi32(-cospi[57]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim60 = _mm_set1_epi32(-cospi[60]);
  const __m128i cospim61 = _mm_set1_epi32(-cospi[61]);

  {
    __m128i u[64];
    __m128i tmp1, tmp2, tmp3, tmp4;
    // stage 1
    u[0] = in[0];
    u[32] = in[1];
    u[36] = in[9];
    u[40] = in[5];
    u[44] = in[13];
    u[48] = in[3];
    u[52] = in[11];
    u[56] = in[7];
    u[60] = in[15];
    u[16] = in[2];
    u[20] = in[10];
    u[24] = in[6];
    u[28] = in[14];
    u[4] = in[8];
    u[8] = in[4];
    u[12] = in[12];

    // stage 2
    u[63] = half_btf_0_sse4_1(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_sse4_1(&cospi63, &u[32], &rnding, bit);
    u[35] = half_btf_0_sse4_1(&cospim49, &u[60], &rnding, bit);
    u[60] = half_btf_0_sse4_1(&cospi15, &u[60], &rnding, bit);
    u[59] = half_btf_0_sse4_1(&cospi9, &u[36], &rnding, bit);
    u[36] = half_btf_0_sse4_1(&cospi55, &u[36], &rnding, bit);
    u[39] = half_btf_0_sse4_1(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_sse4_1(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_sse4_1(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_sse4_1(&cospi59, &u[40], &rnding, bit);
    u[43] = half_btf_0_sse4_1(&cospim53, &u[52], &rnding, bit);
    u[52] = half_btf_0_sse4_1(&cospi11, &u[52], &rnding, bit);
    u[47] = half_btf_0_sse4_1(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_sse4_1(&cospi3, &u[48], &rnding, bit);
    u[51] = half_btf_0_sse4_1(&cospi13, &u[44], &rnding, bit);
    u[44] = half_btf_0_sse4_1(&cospi51, &u[44], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_sse4_1(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_sse4_1(&cospi62, &u[16], &rnding, bit);
    u[19] = half_btf_0_sse4_1(&cospim50, &u[28], &rnding, bit);
    u[28] = half_btf_0_sse4_1(&cospi14, &u[28], &rnding, bit);
    u[27] = half_btf_0_sse4_1(&cospi10, &u[20], &rnding, bit);
    u[20] = half_btf_0_sse4_1(&cospi54, &u[20], &rnding, bit);
    u[23] = half_btf_0_sse4_1(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_sse4_1(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[34] = u[35];
    u[37] = u[36];
    u[38] = u[39];
    u[41] = u[40];
    u[42] = u[43];
    u[45] = u[44];
    u[46] = u[47];
    u[49] = u[48];
    u[50] = u[51];
    u[53] = u[52];
    u[54] = u[55];
    u[57] = u[56];
    u[58] = u[59];
    u[61] = u[60];
    u[62] = u[63];

    // stage 4
    u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);
    u[11] = half_btf_0_sse4_1(&cospim52, &u[12], &rnding, bit);
    u[12] = half_btf_0_sse4_1(&cospi12, &u[12], &rnding, bit);

    u[17] = u[16];
    u[18] = u[19];
    u[21] = u[20];
    u[22] = u[23];
    u[25] = u[24];
    u[26] = u[27];
    u[29] = u[28];
    u[30] = u[31];

    tmp1 = half_btf_sse4_1(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim60, &u[34], &cospim4, &u[61], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim36, &u[37], &cospi28, &u[58], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = half_btf_sse4_1(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospi28, &u[37], &cospi36, &u[58], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospim4, &u[34], &cospi60, &u[61], &rnding, bit);
    u[62] = half_btf_sse4_1(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = tmp1;
    u[34] = tmp2;
    u[37] = tmp3;
    u[38] = tmp4;

    tmp1 = half_btf_sse4_1(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim44, &u[42], &cospim20, &u[53], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim52, &u[45], &cospi12, &u[50], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_sse4_1(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospi12, &u[45], &cospi52, &u[50], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospim20, &u[42], &cospi44, &u[53], &rnding, bit);
    u[54] = half_btf_sse4_1(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = tmp1;
    u[42] = tmp2;
    u[45] = tmp3;
    u[46] = tmp4;

    // stage 5
    u[7] = half_btf_0_sse4_1(&cospi8, &u[4], &rnding, bit);
    u[4] = half_btf_0_sse4_1(&cospi56, &u[4], &rnding, bit);

    u[9] = u[8];
    u[10] = u[11];
    u[13] = u[12];
    u[14] = u[15];

    tmp1 = half_btf_sse4_1(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim56, &u[18], &cospim8, &u[29], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim40, &u[21], &cospi24, &u[26], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_sse4_1(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospi24, &u[21], &cospi40, &u[26], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospim8, &u[18], &cospi56, &u[29], &rnding, bit);
    u[30] = half_btf_sse4_1(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = tmp1;
    u[18] = tmp2;
    u[21] = tmp3;
    u[22] = tmp4;

    for (i = 32; i < 64; i += 8) {
      addsub_sse4_1(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                    &clamp_hi);

      addsub_sse4_1(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                    &clamp_hi);
    }

    // stage 6
    tmp1 = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[0] = tmp1;
    u[5] = u[4];
    u[6] = u[7];

    tmp1 = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = tmp1;
    tmp2 = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    u[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    u[10] = tmp2;

    for (i = 16; i < 32; i += 8) {
      addsub_sse4_1(u[i + 0], u[i + 3], &u[i + 0], &u[i + 3], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 1], u[i + 2], &u[i + 1], &u[i + 2], &clamp_lo,
                    &clamp_hi);

      addsub_sse4_1(u[i + 7], u[i + 4], &u[i + 7], &u[i + 4], &clamp_lo,
                    &clamp_hi);
      addsub_sse4_1(u[i + 6], u[i + 5], &u[i + 6], &u[i + 5], &clamp_lo,
                    &clamp_hi);
    }

    tmp1 = half_btf_sse4_1(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[59] = half_btf_sse4_1(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[60] = half_btf_sse4_1(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = tmp1;
    u[35] = tmp2;
    u[36] = tmp3;
    u[37] = tmp4;

    tmp1 = half_btf_sse4_1(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[51] = half_btf_sse4_1(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[52] = half_btf_sse4_1(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = tmp1;
    u[43] = tmp2;
    u[44] = tmp3;
    u[45] = tmp4;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    tmp1 = half_btf_sse4_1(&cospim32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[6] = half_btf_sse4_1(&cospi32, &u[5], &cospi32, &u[6], &rnding, bit);
    u[5] = tmp1;
    addsub_sse4_1(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    tmp1 = half_btf_sse4_1(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    tmp2 = half_btf_sse4_1(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    tmp3 = half_btf_sse4_1(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    tmp4 = half_btf_sse4_1(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[27] = half_btf_sse4_1(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[28] = half_btf_sse4_1(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = tmp1;
    u[19] = tmp2;
    u[20] = tmp3;
    u[21] = tmp4;

    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_sse4_1(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_sse4_1(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                      &clamp_hi);
      }
    }

    // stage 8
    for (i = 0; i < 4; ++i) {
      addsub_sse4_1(u[i], u[7 - i], &u[i], &u[7 - i], &clamp_lo, &clamp_hi);
    }

    idct64_stage8_sse4_1(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                         &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                         bit);

    // stage 10
    idct64_stage10_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                          bit);

    // stage 11
    idct64_stage11_sse4_1(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}